

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessage
          (ExtensionSet *this,int number,MessageLite *prototype,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  MessageLite *this_00;
  int iVar1;
  Extension *pEVar2;
  Nonnull<const_char_*> failure_msg;
  uint8_t *puVar3;
  undefined4 extraout_var;
  anon_enum_32 local_3c;
  LogMessage local_38;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x217,"extension != nullptr");
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_38,(char (*) [12])"not present")
    ;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  local_38.errno_saver_.saved_errno_ = pEVar2->is_repeated ^ CPPTYPE_INT32;
  local_3c = OPTIONAL_FIELD;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                          ((anon_enum_32 *)&local_38,&local_3c,
                           "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                          );
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_38.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar2->type);
    local_3c = 10;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_38,&local_3c,
                             "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      this_00 = (MessageLite *)(pEVar2->field_0).int64_t_value;
      if ((pEVar2->field_0xa & 4) == 0) {
        iVar1 = MessageLite::GetCachedSize(this_00);
        puVar3 = WireFormatLite::InternalWriteMessage(number,this_00,iVar1,target,stream);
      }
      else {
        iVar1 = (*this_00->_vptr_MessageLite[0x14])(this_00,prototype,number,target,stream);
        puVar3 = (uint8_t *)CONCAT44(extraout_var,iVar1);
      }
      return puVar3;
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,0x218,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

uint8_t* ExtensionSet::InternalSerializeMessage(
    int number, const MessageLite* prototype, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "not present";
  ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);

  if (extension->is_lazy) {
    return extension->ptr.lazymessage_value->WriteMessageToArray(
        prototype, number, target, stream);
  }

  const auto* msg = extension->ptr.message_value;
  return WireFormatLite::InternalWriteMessage(
      number, *msg, msg->GetCachedSize(), target, stream);
}